

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)> * __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>::Iterator::
Clone(Iterator *this)

{
  ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)> *pPVar1;
  
  pPVar1 = (ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)> *)
           operator_new(0x20);
  pPVar1->_vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_00f03cb0;
  pPVar1[1]._vptr_ParamIteratorInterface = (_func_int **)this->base_;
  pPVar1[2]._vptr_ParamIteratorInterface = (_func_int **)(this->iterator_)._M_current;
  pPVar1[3]._vptr_ParamIteratorInterface = (_func_int **)0x0;
  return pPVar1;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }